

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForInObjectEnumerator.cpp
# Opt level: O2

void __thiscall
Js::ForInObjectEnumerator::ShadowData::ShadowData
          (ShadowData *this,RecyclableObject *initObject,RecyclableObject *firstPrototype,
          Recycler *recycler)

{
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->currentObject,initObject);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet
            (&this->firstPrototype,firstPrototype);
  BVSparse<Memory::Recycler>::BVSparse(&this->propertyIds,recycler);
  SListBase<const_Js::PropertyRecord_*,_Memory::Recycler,_RealCount>::SListBase
            (&this->newPropertyStrings);
  return;
}

Assistant:

ForInObjectEnumerator::ShadowData::ShadowData(
        RecyclableObject * initObject,
        RecyclableObject * firstPrototype,
        Recycler * recycler)
        : currentObject(initObject),
          firstPrototype(firstPrototype),
          propertyIds(recycler)
    {
    }